

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  char cVar6;
  ulong uVar7;
  undefined1 uVar8;
  byte *end_00;
  long lVar9;
  byte *pbVar10;
  
  if (end <= ptr) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr;
  end_00 = (byte *)(ptr + (uVar7 & 0xfffffffffffffffe));
  if ((uVar7 & 0xfffffffffffffffe) == 0) {
    end_00 = (byte *)end;
  }
  if ((uVar7 & 1) == 0) {
    end_00 = (byte *)end;
  }
  if (uVar7 == 1) {
    return -1;
  }
  bVar2 = ptr[1];
  if (bVar2 < 0xdc) {
    uVar8 = 7;
    if (3 < bVar2 - 0xd8) {
      if (bVar2 == 0) {
        uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_0055b3cb:
        uVar8 = 0x1d;
      }
    }
  }
  else if (bVar2 - 0xdc < 4) {
    uVar8 = 8;
  }
  else {
    if ((bVar2 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0055b3cb;
    uVar8 = 0;
  }
  bVar3 = false;
  iVar5 = 0x12;
  switch(uVar8) {
  case 2:
    pbVar10 = (byte *)(ptr + 2);
    if ((long)end_00 - (long)pbVar10 < 2) {
      return -1;
    }
    bVar2 = ptr[3];
    if (bVar2 < 0xdc) {
      bVar4 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar10);
        }
        else {
LAB_0055b8d7:
          bVar4 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar4 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (*pbVar10 < 0xfe)) goto LAB_0055b8d7;
      bVar4 = 0;
    }
    switch(bVar4) {
    case 0xf:
      iVar5 = little2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
      return iVar5;
    case 0x10:
      iVar5 = little2_scanDecl(enc,ptr + 4,(char *)end_00,nextTokPtr);
      return iVar5;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x16:
    case 0x18:
switchD_0055b901_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar4 - 5 < 3) || (bVar4 == 0x1d)) goto switchD_0055b901_caseD_16;
    }
switchD_0055b8b7_default:
    *nextTokPtr = ptr + 2;
    goto LAB_0055b769;
  default:
switchD_0055b3f1_caseD_3:
    *nextTokPtr = ptr;
    return 0;
  case 4:
    pcVar1 = ptr + 2;
    iVar5 = -0x1a;
    if (1 < (long)end_00 - (long)pcVar1) {
      if ((ptr[3] == '\0') && (*pcVar1 == ']')) {
        if ((long)end_00 - (long)pcVar1 < 4) {
          return -1;
        }
        if ((ptr[5] == '\0') && (ptr[4] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar1;
      iVar5 = 0x1a;
    }
    break;
  case 5:
    if ((long)end_00 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_0055b48d_caseD_5;
  case 6:
    if ((long)end_00 - (long)ptr < 3) {
      return -2;
    }
    goto switchD_0055b48d_caseD_5;
  case 7:
    lVar9 = (long)end_00 - (long)ptr;
switchD_0055b48d_caseD_7:
    if (lVar9 < 4) {
      return -2;
    }
switchD_0055b48d_caseD_5:
    *nextTokPtr = ptr;
LAB_0055b769:
    iVar5 = 0;
    break;
  case 9:
    if ((byte *)(ptr + 2) == end_00) {
      *nextTokPtr = (char *)end_00;
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar10 = (byte *)(ptr + 2);
    for (lVar9 = (long)end_00 - (long)pbVar10; 1 < lVar9; lVar9 = lVar9 + -2) {
      bVar2 = pbVar10[1];
      if (bVar2 < 0xdc) {
        cVar6 = '\a';
        if (3 < bVar2 - 0xd8) {
          if (bVar2 == 0) {
            cVar6 = *(char *)((long)enc[1].scanners + (ulong)*pbVar10);
          }
          else {
LAB_0055b709:
            cVar6 = '\x1d';
          }
        }
      }
      else if (bVar2 - 0xdc < 4) {
        cVar6 = '\b';
      }
      else {
        if ((bVar2 != 0xff) || (*pbVar10 < 0xfe)) goto LAB_0055b709;
        cVar6 = '\0';
      }
      if (((cVar6 != '\x15') && (cVar6 != '\n')) && ((cVar6 != '\t' || (pbVar10 + 2 == end_00))))
      break;
      pbVar10 = pbVar10 + 2;
    }
    *nextTokPtr = (char *)pbVar10;
    iVar5 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x11;
    break;
  case 0xc:
    iVar5 = 0xc;
    goto LAB_0055b779;
  case 0xd:
    iVar5 = 0xd;
LAB_0055b779:
    iVar5 = little2_scanLit(iVar5,enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar5;
  case 0x13:
    iVar5 = little2_scanPoundName(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar5;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_0055b3f1_caseD_16;
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0055b3f1_caseD_19;
  case 0x1d:
    bVar4 = *ptr;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] * 0x20 + (uint)(bVar4 >> 5) * 4))
         >> (bVar4 & 0x1f) & 1) != 0) {
      bVar3 = false;
      goto switchD_0055b3f1_caseD_16;
    }
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] * 0x20 +
                         (uint)(bVar4 >> 5) * 4)) & 1 << (bVar4 & 0x1f)) == 0)
    goto switchD_0055b3f1_caseD_3;
    goto switchD_0055b3f1_caseD_19;
  case 0x1e:
    iVar5 = little2_scanPercent(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar5;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x17;
    break;
  case 0x20:
    pbVar10 = (byte *)(ptr + 2);
    if ((long)end_00 - (long)pbVar10 < 2) {
      return -0x18;
    }
    bVar2 = ptr[3];
    if (bVar2 < 0xdc) {
      bVar4 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar10);
        }
        else {
LAB_0055b87f:
          bVar4 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      bVar4 = 8;
    }
    else {
      if ((bVar2 != 0xff) || (*pbVar10 < 0xfe)) goto LAB_0055b87f;
      bVar4 = 0;
    }
    if (bVar4 < 0x20) {
      if (2 < bVar4 - 9) {
        if (bVar4 == 0xf) {
          *nextTokPtr = ptr + 4;
          return 0x23;
        }
        if (bVar4 != 0x15) goto switchD_0055b8b7_default;
      }
switchD_0055b8b7_caseD_20:
      *nextTokPtr = (char *)pbVar10;
      iVar5 = 0x18;
    }
    else {
      switch(bVar4) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_0055b8b7_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 4;
        iVar5 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 4;
        iVar5 = 0x25;
        break;
      default:
        goto switchD_0055b8b7_default;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar5 = 0x15;
  }
  return iVar5;
switchD_0055b3f1_caseD_19:
  iVar5 = 0x13;
  bVar3 = true;
switchD_0055b3f1_caseD_16:
  ptr = ptr + 2;
  lVar9 = (long)end_00 - (long)ptr;
  do {
    if (lVar9 < 2) {
      return -iVar5;
    }
    bVar2 = ((byte *)ptr)[1];
    if (bVar2 < 0xdc) {
      uVar8 = 7;
      if (3 < bVar2 - 0xd8) {
        if (bVar2 == 0) {
          uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        }
        else {
LAB_0055b471:
          uVar8 = 0x1d;
        }
      }
    }
    else if (bVar2 - 0xdc < 4) {
      uVar8 = 8;
    }
    else {
      if ((bVar2 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_0055b471;
      uVar8 = 0;
    }
    switch(uVar8) {
    default:
      goto switchD_0055b48d_caseD_5;
    case 6:
      if (lVar9 == 2) {
        return -2;
      }
      goto switchD_0055b48d_caseD_5;
    case 7:
      goto switchD_0055b48d_caseD_7;
    case 9:
    case 10:
    case 0xb:
    case 0x14:
    case 0x15:
    case 0x1e:
    case 0x20:
    case 0x23:
    case 0x24:
      *nextTokPtr = ptr;
      return iVar5;
    case 0xf:
      if (!bVar3) {
        *nextTokPtr = (char *)((byte *)ptr + 2);
        return 0x1e;
      }
      goto switchD_0055b48d_caseD_5;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)*ptr >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >> ((byte)*ptr & 0x1f)
          & 1) == 0) goto switchD_0055b48d_caseD_5;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      ptr = (char *)((byte *)ptr + 2);
      lVar9 = lVar9 + -2;
      break;
    case 0x21:
      if (!bVar3) {
        *nextTokPtr = (char *)((byte *)ptr + 2);
        return 0x1f;
      }
      goto switchD_0055b48d_caseD_5;
    case 0x22:
      if (!bVar3) {
        *nextTokPtr = (char *)((byte *)ptr + 2);
        return 0x20;
      }
      goto switchD_0055b48d_caseD_5;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}